

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O2

int Abc_NtkDfsOne_rec(Abc_Obj_t *pObj,Vec_Int_t *vTfi,int nLevelMin,int CiLabel)

{
  long *plVar1;
  Sfm_Dec_t *p;
  Abc_Obj_t *pObj_00;
  int iVar2;
  uint uVar3;
  word wVar4;
  Vec_Int_t *p_00;
  int iVar5;
  long lVar6;
  word uFanins [6];
  word local_68 [7];
  
  iVar2 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar2 == 0) {
    Abc_NodeSetTravIdCurrent(pObj);
    uVar3 = *(uint *)&pObj->field_0x14 & 0xf;
    if (((uVar3 == 2) || (uVar3 == 5)) ||
       (((int)(*(uint *)&pObj->field_0x14 >> 0xc) < nLevelMin && (0 < (pObj->vFanins).nSize)))) {
      Vec_IntPush(vTfi,pObj->Id);
      (pObj->field_6).iTemp = CiLabel;
      return CiLabel;
    }
    if (uVar3 != 7) {
      __assert_fail("Abc_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                    ,0x593,"int Abc_NtkDfsOne_rec(Abc_Obj_t *, Vec_Int_t *, int, int)");
    }
    iVar2 = (pObj->vFanins).nSize;
    lVar6 = 0;
    iVar5 = 0;
    if (iVar2 == 0) {
      iVar5 = CiLabel;
    }
    (pObj->field_6).iTemp = iVar5;
    for (; lVar6 < iVar2; lVar6 = lVar6 + 1) {
      uVar3 = Abc_NtkDfsOne_rec((Abc_Obj_t *)
                                pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar6]],vTfi,
                                nLevelMin,CiLabel);
      (pObj->field_6).iTemp = (pObj->field_6).iTemp | uVar3;
      iVar2 = (pObj->vFanins).nSize;
    }
    Vec_IntPush(vTfi,pObj->Id);
    plVar1 = (long *)pObj->pNtk->pData;
    if (*(int *)(*plVar1 + 0x5c) != 0) {
      iVar2 = pObj->Id;
      wVar4 = Sfm_ObjSimulate(pObj);
      Vec_WrdWriteEntry((Vec_Wrd_t *)(plVar1 + 0x28),iVar2,wVar4);
      if (((ulong)pObj->field_6 & 0x10) != 0) {
        iVar2 = pObj->Id;
        p = (Sfm_Dec_t *)pObj->pNtk->pData;
        p_00 = Mio_GateReadExpr((Mio_Gate_t *)(pObj->field_5).pData);
        for (lVar6 = 0; iVar5 = (pObj->vFanins).nSize, lVar6 < iVar5; lVar6 = lVar6 + 1) {
          pObj_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar6]];
          if (((ulong)pObj_00->field_6 & 0x10) == 0) {
            wVar4 = Sfm_DecObjSim(p,pObj_00);
          }
          else {
            wVar4 = Sfm_DecObjSim2(p,pObj_00);
          }
          local_68[lVar6] = wVar4;
        }
        wVar4 = Exp_Truth6(iVar5,p_00,local_68);
        Vec_WrdWriteEntry((Vec_Wrd_t *)(plVar1 + 0x2a),iVar2,wVar4);
      }
    }
  }
  return (pObj->field_6).iTemp;
}

Assistant:

int Abc_NtkDfsOne_rec( Abc_Obj_t * pObj, Vec_Int_t * vTfi, int nLevelMin, int CiLabel )
{
    Abc_Obj_t * pFanin; int i;
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return pObj->iTemp;
    Abc_NodeSetTravIdCurrent( pObj );
    if ( Abc_ObjIsCi(pObj) || (Abc_ObjLevel(pObj) < nLevelMin && Abc_ObjFaninNum(pObj) > 0) )
    {
        Vec_IntPush( vTfi, Abc_ObjId(pObj) );
        return (pObj->iTemp = CiLabel);
    }
    assert( Abc_ObjIsNode(pObj) );
    pObj->iTemp = Abc_ObjFaninNum(pObj) ? 0 : CiLabel;
    Abc_ObjForEachFanin( pObj, pFanin, i )
        pObj->iTemp |= Abc_NtkDfsOne_rec( pFanin, vTfi, nLevelMin, CiLabel );
    Vec_IntPush( vTfi, Abc_ObjId(pObj) );
    Sfm_ObjSimulateNode( pObj );
    return pObj->iTemp;
}